

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O0

bool draco::DecodeRawSymbols<draco::RAnsSymbolDecoder>
               (uint32_t num_values,DecoderBuffer *src_buffer,uint32_t *out_values)

{
  bool bVar1;
  DecoderBuffer *in_RDX;
  uint8_t max_bit_length;
  uint32_t *in_stack_00000060;
  DecoderBuffer *in_stack_00000068;
  uint32_t in_stack_00000070;
  undefined4 in_stack_00000074;
  DecoderBuffer *in_stack_00000078;
  uint32_t in_stack_00000080;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  bool local_1;
  
  bVar1 = DecoderBuffer::Decode<unsigned_char>
                    (in_RDX,(uchar *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (bVar1) {
    switch(in_stack_ffffffffffffffe7) {
    case 1:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<1>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 2:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<2>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 3:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<3>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 4:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<4>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 5:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<5>>
                          (in_stack_00000070,in_stack_00000068,in_stack_00000060);
      break;
    case 6:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<6>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 7:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<7>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 8:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<8>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 9:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<9>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 10:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<10>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0xb:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<11>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0xc:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<12>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0xd:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<13>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0xe:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<14>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0xf:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<15>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0x10:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<16>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0x11:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<17>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    case 0x12:
      local_1 = DecodeRawSymbolsInternal<draco::RAnsSymbolDecoder<18>>
                          (in_stack_00000080,in_stack_00000078,
                           (uint32_t *)CONCAT44(in_stack_00000074,in_stack_00000070));
      break;
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DecodeRawSymbols(uint32_t num_values, DecoderBuffer *src_buffer,
                      uint32_t *out_values) {
  uint8_t max_bit_length;
  if (!src_buffer->Decode(&max_bit_length)) {
    return false;
  }
  switch (max_bit_length) {
    case 1:
      return DecodeRawSymbolsInternal<SymbolDecoderT<1>>(num_values, src_buffer,
                                                         out_values);
    case 2:
      return DecodeRawSymbolsInternal<SymbolDecoderT<2>>(num_values, src_buffer,
                                                         out_values);
    case 3:
      return DecodeRawSymbolsInternal<SymbolDecoderT<3>>(num_values, src_buffer,
                                                         out_values);
    case 4:
      return DecodeRawSymbolsInternal<SymbolDecoderT<4>>(num_values, src_buffer,
                                                         out_values);
    case 5:
      return DecodeRawSymbolsInternal<SymbolDecoderT<5>>(num_values, src_buffer,
                                                         out_values);
    case 6:
      return DecodeRawSymbolsInternal<SymbolDecoderT<6>>(num_values, src_buffer,
                                                         out_values);
    case 7:
      return DecodeRawSymbolsInternal<SymbolDecoderT<7>>(num_values, src_buffer,
                                                         out_values);
    case 8:
      return DecodeRawSymbolsInternal<SymbolDecoderT<8>>(num_values, src_buffer,
                                                         out_values);
    case 9:
      return DecodeRawSymbolsInternal<SymbolDecoderT<9>>(num_values, src_buffer,
                                                         out_values);
    case 10:
      return DecodeRawSymbolsInternal<SymbolDecoderT<10>>(
          num_values, src_buffer, out_values);
    case 11:
      return DecodeRawSymbolsInternal<SymbolDecoderT<11>>(
          num_values, src_buffer, out_values);
    case 12:
      return DecodeRawSymbolsInternal<SymbolDecoderT<12>>(
          num_values, src_buffer, out_values);
    case 13:
      return DecodeRawSymbolsInternal<SymbolDecoderT<13>>(
          num_values, src_buffer, out_values);
    case 14:
      return DecodeRawSymbolsInternal<SymbolDecoderT<14>>(
          num_values, src_buffer, out_values);
    case 15:
      return DecodeRawSymbolsInternal<SymbolDecoderT<15>>(
          num_values, src_buffer, out_values);
    case 16:
      return DecodeRawSymbolsInternal<SymbolDecoderT<16>>(
          num_values, src_buffer, out_values);
    case 17:
      return DecodeRawSymbolsInternal<SymbolDecoderT<17>>(
          num_values, src_buffer, out_values);
    case 18:
      return DecodeRawSymbolsInternal<SymbolDecoderT<18>>(
          num_values, src_buffer, out_values);
    default:
      return false;
  }
}